

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int gap_lr_spill_cost(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  lr_bb_t_conflict plVar1;
  bb_t_conflict bb;
  out_edge_t peVar2;
  in_edge_t_conflict peVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DLIST_in_edge_t *pDVar7;
  int iVar8;
  live_range_t_conflict plVar9;
  DLIST_out_edge_t *pDVar10;
  
  bitmap_clear(gen_ctx->temp_bitmap);
  plVar9 = lr;
  while (plVar1 = plVar9->lr_bb, plVar1 != (lr_bb_t_conflict)0x0) {
    bitmap_set_bit_p(gen_ctx->temp_bitmap,plVar1->bb->index);
    plVar9 = (live_range_t_conflict)&plVar1->next;
  }
  iVar8 = 0;
  while( true ) {
    plVar1 = lr->lr_bb;
    if (plVar1 == (lr_bb_t_conflict)0x0) break;
    bb = plVar1->bb;
    iVar4 = bb_loop_level(bb);
    iVar6 = -1;
    pDVar10 = &bb->out_edges;
    while (peVar2 = pDVar10->head, peVar2 != (out_edge_t)0x0) {
      iVar5 = bitmap_bit_p(gen_ctx->temp_bitmap,peVar2->dst->index);
      if (iVar5 == 0) {
        iVar5 = bb_loop_level(peVar2->dst);
        if (iVar6 <= iVar5) {
          iVar6 = iVar5 + 1;
        }
      }
      pDVar10 = (DLIST_out_edge_t *)&(peVar2->out_link).next;
    }
    iVar4 = iVar4 + 1;
    if (-1 < iVar6) {
      if (iVar4 <= iVar6) {
        iVar6 = iVar4;
      }
      iVar8 = iVar8 + iVar6 * 2;
    }
    iVar6 = -1;
    pDVar7 = &bb->in_edges;
    while (peVar3 = pDVar7->head, peVar3 != (in_edge_t_conflict)0x0) {
      iVar5 = bitmap_bit_p(gen_ctx->temp_bitmap,peVar3->src->index);
      if (iVar5 == 0) {
        iVar5 = bb_loop_level(peVar3->src);
        if (iVar6 <= iVar5) {
          iVar6 = iVar5 + 1;
        }
      }
      pDVar7 = (DLIST_in_edge_t *)&(peVar3->in_link).next;
    }
    if (-1 < iVar6) {
      if (iVar6 < iVar4) {
        iVar4 = iVar6;
      }
      iVar8 = iVar8 + iVar4 * 2;
    }
    lr = (live_range_t_conflict)&plVar1->next;
  }
  return iVar8;
}

Assistant:

static int gap_lr_spill_cost (gen_ctx_t gen_ctx, live_range_t lr) {
  int cost_factor = LOOP_COST_FACTOR / 2;
  bitmap_clear (temp_bitmap);
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
    bitmap_set_bit_p (temp_bitmap, lr_bb->bb->index);
  int cost = 0;
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next) {
    bb_t bb = lr_bb->bb;
    int level, max_level, bb_level = bb_loop_level (bb) + 1;
    edge_t e;
    max_level = -1;
    for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->dst->index)
          && (level = bb_loop_level (e->dst) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
    max_level = -1;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->src->index)
          && (level = bb_loop_level (e->src) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
  }
  return cost;
}